

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_runner_impl.hpp
# Opt level: O0

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandler local_11;
  RunContext *pRStack_10;
  FatalConditionHandler fatalConditionHandler;
  RunContext *this_local;
  
  pRStack_10 = this;
  FatalConditionHandler::FatalConditionHandler(&local_11);
  TestCase::invoke(this->m_activeTestCase);
  FatalConditionHandler::reset(&local_11);
  FatalConditionHandler::~FatalConditionHandler(&local_11);
  return;
}

Assistant:

void invokeActiveTestCase() {
            FatalConditionHandler fatalConditionHandler; // Handle signals
            m_activeTestCase->invoke();
            fatalConditionHandler.reset();
        }